

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O0

bool __thiscall chatra::RuntimeImp::distributeStringTable(RuntimeImp *this,uint oldVersion)

{
  uint uVar1;
  element_type *peVar2;
  EVP_PKEY_CTX *src;
  undefined1 local_38 [24];
  lock_guard<chatra::SpinLock> lock0;
  uint oldVersion_local;
  RuntimeImp *this_local;
  
  lock0._M_device._4_4_ = oldVersion;
  if (oldVersion != 0xffffffff) {
    peVar2 = std::__shared_ptr_access<chatra::StringTable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<chatra::StringTable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->primarySTable);
    uVar1 = StringTable::getVersion(peVar2);
    if (oldVersion == uVar1) {
      return false;
    }
  }
  peVar2 = std::__shared_ptr_access<chatra::StringTable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<chatra::StringTable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->primarySTable);
  StringTable::clearDirty(peVar2);
  std::lock_guard<chatra::SpinLock>::lock_guard
            ((lock_guard<chatra::SpinLock> *)(local_38 + 0x10),&this->lockSTable);
  peVar2 = std::__shared_ptr_access<chatra::StringTable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<chatra::StringTable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->primarySTable);
  StringTable::copy((StringTable *)local_38,(EVP_PKEY_CTX *)peVar2,src);
  std::shared_ptr<chatra::StringTable>::operator=
            (&this->distributedSTable,(shared_ptr<chatra::StringTable> *)local_38);
  std::shared_ptr<chatra::StringTable>::~shared_ptr((shared_ptr<chatra::StringTable> *)local_38);
  std::lock_guard<chatra::SpinLock>::~lock_guard((lock_guard<chatra::SpinLock> *)(local_38 + 0x10));
  IdPool<chatra::Requester,chatra::Thread>::
  forEach<chatra::RuntimeImp::distributeStringTable(unsigned_int)::__0>
            ((IdPool<chatra::Requester,chatra::Thread> *)&this->threadIds);
  return true;
}

Assistant:

bool RuntimeImp::distributeStringTable(unsigned oldVersion) {
	if (oldVersion != UINT_MAX && oldVersion == primarySTable->getVersion())
		return false;

	primarySTable->clearDirty();
	{
		std::lock_guard<SpinLock> lock0(lockSTable);
		distributedSTable = primarySTable->copy();
	}
	threadIds.forEach([&](Thread& thread) {
		thread.hasNewSTable = true;
	});

	return true;
}